

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void set_wall_state(level *lev)

{
  int x;
  int y0;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int y;
  int iVar11;
  int iVar12;
  uint *puVar13;
  uint *puVar14;
  int iVar15;
  undefined8 uVar16;
  
  puVar13 = (uint *)&lev->locations[0][0].field_0x6;
  lVar7 = 0;
  do {
    y = 1;
    uVar16 = 1;
    if (lVar7 == 0x50) {
      return;
    }
    x = (int)lVar7;
    lVar7 = lVar7 + 1;
    iVar5 = x + 1;
    uVar8 = (ulong)(x - 1);
    puVar14 = puVar13;
    for (; iVar1 = (int)uVar8, y != 0x16; y = y + 1) {
      if (0xe < *(byte *)((long)puVar14 + -2) - 1) goto switchD_0016a29c_caseD_c;
      y0 = y + -1;
      iVar2 = y;
      iVar3 = iVar5;
      iVar11 = x;
      iVar12 = iVar1;
      iVar9 = iVar5;
      iVar15 = y;
      switch((uint)*(byte *)((long)puVar14 + -2)) {
      case 1:
        uVar6 = 0;
        goto LAB_0016a334;
      case 2:
        uVar6 = 1;
        goto LAB_0016a334;
      case 3:
        iVar9 = y + -2;
        iVar2 = iVar9;
        iVar3 = x;
        iVar11 = iVar1;
        iVar1 = iVar5;
        break;
      case 4:
        iVar9 = y + -2;
        iVar2 = y + -2;
        iVar12 = iVar5;
        break;
      case 5:
        iVar9 = y;
        iVar3 = iVar1;
        iVar15 = y + -2;
        iVar1 = iVar5;
        break;
      case 6:
        iVar9 = y0;
        iVar11 = iVar5;
        iVar12 = x;
        y0 = y;
        iVar15 = y + -2;
        break;
      case 7:
        iVar1 = check_pos(lev,x + -1,y + -2,1);
        iVar2 = check_pos(lev,(int)lVar7,y + -2,1);
        iVar3 = check_pos(lev,(int)lVar7,y,1);
        uVar16 = 0x16a39e;
        uVar4 = check_pos(lev,x + -1,y,1);
        uVar10 = iVar2 + iVar1 + iVar3;
        if (uVar10 + uVar4 < 2) {
          uVar6 = 1;
          if (iVar1 == 0) {
            uVar16 = 2;
            uVar6 = 2;
            if (iVar2 == 0) {
              uVar16 = 4;
              uVar6 = 4;
              if ((iVar3 == 0) && (uVar6 = uVar10, uVar4 != 0)) {
                uVar16 = 3;
                uVar6 = 3;
              }
            }
          }
        }
        else {
          if ((iVar1 != 0) && (iVar3 != 0)) {
            uVar16 = 5;
            uVar6 = 5;
            if (uVar4 == 0 && iVar2 == 0) goto LAB_0016a4ab;
          }
          if (uVar4 != 0) {
            uVar16 = 6;
            uVar4 = 6;
          }
          uVar6 = uVar4;
          if (iVar2 == 0) {
            uVar6 = 0;
          }
          if (iVar3 != 0 || iVar1 != 0) {
            uVar6 = 0;
          }
        }
        goto LAB_0016a4ab;
      case 8:
        y0 = y;
        iVar9 = iVar1;
        iVar2 = y + -2;
        iVar15 = y + -2;
        goto LAB_0016a4a2;
      case 9:
        y0 = y + -2;
        iVar3 = iVar1;
        goto LAB_0016a4a2;
      case 10:
        iVar3 = iVar1;
        iVar11 = iVar5;
        iVar9 = iVar1;
        iVar2 = y + -2;
        goto LAB_0016a4a2;
      case 0xb:
        iVar11 = iVar1;
        iVar15 = y + -2;
LAB_0016a4a2:
        uVar6 = set_twall(lev,iVar11,y0,iVar3,iVar2,iVar9,iVar15,(int)uVar16,iVar1);
        goto LAB_0016a4ab;
      default:
        goto switchD_0016a29c_caseD_c;
      case 0xf:
        uVar6 = *puVar14 >> 9 & 1;
LAB_0016a334:
        uVar16 = 0x16a339;
        uVar6 = set_wall(lev,x,y0,uVar6);
        goto LAB_0016a4ab;
      }
      uVar6 = set_corn(lev,iVar11,iVar9,iVar3,iVar2,iVar12,y0,iVar1,iVar15);
LAB_0016a4ab:
      *puVar14 = *puVar14 & 0xffffff8f | (uVar6 & 0x1f) << 4;
switchD_0016a29c_caseD_c:
      puVar14 = puVar14 + 3;
    }
    puVar13 = puVar13 + 0x3f;
  } while( true );
}

Assistant:

void set_wall_state(struct level *lev)
{
    int x, y;
    int wmode;
    struct rm *loc;

    for (x = 0; x < COLNO; x++)
	for (loc = &lev->locations[x][0], y = 0; y < ROWNO; y++, loc++) {
	    switch (loc->typ) {
		case SDOOR:
		    wmode = set_wall(lev, x, y, (int) loc->horizontal);
		    break;
		case VWALL:
		    wmode = set_wall(lev, x, y, 0);
		    break;
		case HWALL:
		    wmode = set_wall(lev, x, y, 1);
		    break;
		case TDWALL:
		    wmode = set_twall(lev, x,y, x,y-1, x-1,y+1, x+1,y+1);
		    break;
		case TUWALL:
		    wmode = set_twall(lev, x,y, x,y+1, x+1,y-1, x-1,y-1);
		    break;
		case TLWALL:
		    wmode = set_twall(lev, x,y, x+1,y, x-1,y-1, x-1,y+1);
		    break;
		case TRWALL:
		    wmode = set_twall(lev, x,y, x-1,y, x+1,y+1, x+1,y-1);
		    break;
		case TLCORNER:
		    wmode = set_corn(lev, x-1,y-1, x,y-1, x-1,y, x+1,y+1);
		    break;
		case TRCORNER:
		    wmode = set_corn(lev, x,y-1, x+1,y-1, x+1,y, x-1,y+1);
		    break;
		case BLCORNER:
		    wmode = set_corn(lev, x,y+1, x-1,y+1, x-1,y, x+1,y-1);
		    break;
		case BRCORNER:
		    wmode = set_corn(lev, x+1,y, x+1,y+1, x,y+1, x-1,y-1);
		    break;
		case CROSSWALL:
		    wmode = set_crosswall(lev, x, y);
		    break;

		default:
		    wmode = -1;	/* don't set wall info */
		    break;
	    }

	if (wmode >= 0)
	    loc->wall_info = (loc->wall_info & ~WM_MASK) | wmode;
	}
}